

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

void __thiscall ON_Buffer::Copy(ON_Buffer *this,ON_Buffer *src)

{
  ON_BUFFER_SEGMENT *__s;
  ON__UINT64 local_48;
  size_t local_40;
  ON__UINT64 segment_buffer_size;
  ON_BUFFER_SEGMENT *dst_seg;
  ON_BUFFER_SEGMENT *src_seg;
  ON_Buffer *src_local;
  ON_Buffer *this_local;
  
  dst_seg = src->m_first_segment;
  do {
    if (dst_seg == (ON_BUFFER_SEGMENT *)0x0) {
LAB_005eaa74:
      if (src->m_current_position <= this->m_buffer_size) {
        this->m_current_position = src->m_current_position;
      }
      return;
    }
    if ((this->m_buffer_size != dst_seg->m_segment_position0) ||
       (src->m_buffer_size <= dst_seg->m_segment_position0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x2d9,"","Attempt to copy corrupt source.");
      goto LAB_005eaa74;
    }
    if (dst_seg->m_segment_position0 < dst_seg->m_segment_position1) {
      if (dst_seg->m_segment_buffer == (uchar *)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = dst_seg->m_segment_position1 - dst_seg->m_segment_position0;
      }
      __s = (ON_BUFFER_SEGMENT *)onmalloc(local_40 + 0x30);
      memset(__s,0,0x30);
      if (local_40 != 0) {
        __s->m_segment_buffer = (uchar *)(__s + 1);
        memcpy(__s->m_segment_buffer,dst_seg->m_segment_buffer,local_40);
      }
      if (this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) {
        this->m_first_segment = __s;
      }
      __s->m_prev_segment = this->m_last_segment;
      if (this->m_last_segment != (ON_BUFFER_SEGMENT *)0x0) {
        this->m_last_segment->m_next_segment = __s;
      }
      this->m_last_segment = __s;
      __s->m_segment_position0 = dst_seg->m_segment_position0;
      __s->m_segment_position1 = dst_seg->m_segment_position1;
      if (src->m_buffer_size < __s->m_segment_position1) {
        local_48 = src->m_buffer_size;
      }
      else {
        local_48 = __s->m_segment_position1;
      }
      this->m_buffer_size = local_48;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x2df,"","Attempt to copy corrupt source.");
    }
    dst_seg = dst_seg->m_next_segment;
  } while( true );
}

Assistant:

void ON_Buffer::Copy( const ON_Buffer& src )
{
  const struct ON_BUFFER_SEGMENT* src_seg;
  struct ON_BUFFER_SEGMENT* dst_seg;
  for ( src_seg = src.m_first_segment; 0 != src_seg; src_seg = src_seg->m_next_segment )
  {
    if (    m_buffer_size != src_seg->m_segment_position0 
         || src_seg->m_segment_position0 >= src.m_buffer_size
        )
    {
      ON_ERROR("Attempt to copy corrupt source.");
      break;
    }
    if ( src_seg->m_segment_position0 >= src_seg->m_segment_position1 
        )
    {
      ON_ERROR("Attempt to copy corrupt source.");
      continue;
    }
    ON__UINT64 segment_buffer_size = ( 0 != src_seg->m_segment_buffer)
                               ? src_seg->m_segment_position1 - src_seg->m_segment_position0
                               : 0;
    dst_seg = (struct ON_BUFFER_SEGMENT*)onmalloc(sizeof(*dst_seg) + ((size_t)segment_buffer_size) );
    memset(dst_seg,0,sizeof(*dst_seg));

    if ( segment_buffer_size > 0 )
    {
      dst_seg->m_segment_buffer = (unsigned char*)(dst_seg+1);
      memcpy( dst_seg->m_segment_buffer, src_seg->m_segment_buffer, (size_t)segment_buffer_size ); // segment_buffer_size always < 0xFFFFFFFF
    }

    if ( 0 == m_first_segment )
      m_first_segment = dst_seg;
    dst_seg->m_prev_segment = m_last_segment;
    if ( 0 != m_last_segment )
      m_last_segment->m_next_segment = dst_seg;
    m_last_segment = dst_seg;
    dst_seg->m_segment_position0 = src_seg->m_segment_position0;
    dst_seg->m_segment_position1 = src_seg->m_segment_position1;
    m_buffer_size = (src.m_buffer_size < dst_seg->m_segment_position1)
                  ? src.m_buffer_size
                  : dst_seg->m_segment_position1;
  }
  if ( src.m_current_position <= m_buffer_size )
    m_current_position = src.m_current_position;
  // 27 June, 2001 Dale Lear: Should this copy m_last_error and m_error_handler? Not sure.
}